

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roman.c
# Opt level: O3

uint32_t calculate_value(char *raw,size_t *pos,size_t max)

{
  uint32_t uVar1;
  size_t max_00;
  size_t sVar2;
  int iVar3;
  uint32_t uVar4;
  size_t sVar5;
  
  sVar2 = *pos;
  max_00 = numeral_no(raw[sVar2]);
  if (max_00 == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      uVar4 = ROMAN_VALUE[max_00];
      sVar5 = sVar2;
      while( true ) {
        if (sVar5 == 0) goto LAB_001012ce;
        sVar2 = numeral_no(raw[sVar5 - 1]);
        if (max_00 <= sVar2) break;
        *pos = sVar5 - 1;
        uVar1 = calculate_value(raw,pos,max_00);
        uVar4 = uVar4 - uVar1;
        sVar5 = *pos;
      }
      if (max <= sVar2) goto LAB_001012ce;
      sVar2 = sVar5 - 1;
      *pos = sVar2;
      iVar3 = iVar3 + uVar4;
      max_00 = numeral_no(raw[sVar5 - 1]);
    } while (max_00 != 0);
  }
  uVar4 = 0;
LAB_001012ce:
  return iVar3 + uVar4;
}

Assistant:

uint32_t calculate_value(const char* raw, size_t* pos, size_t max) {
  const size_t my_no = numeral_no(raw[*pos]);
  if (my_no == 0) return 0; // ERROR

  uint32_t value = ROMAN_VALUE[my_no];

  while (*pos > 0 && numeral_no(raw[*pos - 1]) < my_no) {
    *pos -= 1;
    value -= calculate_value(raw, pos, my_no);
  }

  if (*pos > 0 && numeral_no(raw[*pos - 1]) < max) {
    *pos -= 1;
    return value + calculate_value(raw, pos, max);
  } else {
    return value;
  }
}